

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O1

void __thiscall
kj::
Table<kj::TreeMap<int,_kj::StringPtr>::Entry,_kj::TreeIndex<kj::TreeMap<int,_kj::StringPtr>::Callbacks>_>
::Table(Table<kj::TreeMap<int,_kj::StringPtr>::Entry,_kj::TreeIndex<kj::TreeMap<int,_kj::StringPtr>::Callbacks>_>
        *this)

{
  *(undefined8 *)this = 0;
  *(undefined8 *)(this + 8) = 0;
  *(undefined8 *)(this + 0x10) = 0;
  *(undefined8 **)(this + 0x18) = &NullArrayDisposer::instance;
  _::BTreeImpl::BTreeImpl((BTreeImpl *)(this + 0x28));
  return;
}

Assistant:

Table<Row, Indexes...>::Table() {}